

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigRet.c
# Opt level: O1

void Rtm_ObjRetimeFwd(Rtm_Man_t *pRtm,Rtm_Obj_t *pObj)

{
  Rtm_Edg_t *pRVar1;
  uint uVar2;
  uint *puVar3;
  uint uVar4;
  ulong uVar5;
  uint *puVar6;
  uint uVar7;
  int iVar8;
  int iVar9;
  
  uVar2 = *(uint *)&pObj->field_0x8 >> 7 & 0xff;
  if (uVar2 != 0) {
    uVar5 = 0;
    do {
      if ((*(ushort *)(&pObj[1].field_0x8 + uVar5) & 0xfff) == 0) {
        __assert_fail("Rtm_ObjCheckRetimeFwd(pObj)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                      ,0x208,"void Rtm_ObjRetimeFwd(Rtm_Man_t *, Rtm_Obj_t *)");
      }
      uVar5 = uVar5 + 0x10;
    } while (uVar2 << 4 != uVar5);
  }
  if ((*(ushort *)&pObj->field_0x8 & 0x7f80) == 0) {
    iVar9 = 2;
  }
  else {
    iVar9 = 2;
    uVar5 = 0;
    do {
      pRVar1 = (Rtm_Edg_t *)(&pObj[1].field_0x8 + uVar5 * 0x10);
      uVar2 = *(uint *)(&pObj[1].field_0x8 + uVar5 * 0x10);
      uVar7 = uVar2 & 0xfff;
      if (uVar7 < 0xb) {
        uVar4 = uVar2 >> 2 & 0x3ffff000;
        *(uint *)pRVar1 = uVar4 + uVar7;
        if (uVar7 == 0) {
          __assert_fail("pEdge->nLats > 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                        ,0x5e,"Rtm_Init_t Rtm_ObjRemFirst1(Rtm_Edg_t *)");
        }
        uVar7 = uVar2 >> 0xc & 3;
        *(uint *)pRVar1 = uVar4 | uVar2 - 1 & 0xfff;
      }
      else {
        puVar6 = pRtm->pExtra + (uVar2 >> 0xc);
        *(uint *)pRVar1 = uVar2 & 0xfffff000 | uVar2 - 1 & 0xfff;
        puVar3 = puVar6 + ((ulong)(((uVar2 >> 4 & 0xff) + 1) - (uint)((uVar2 & 0xf) == 0)) - 1);
        uVar7 = 0;
        if (puVar6 <= puVar3) {
          uVar7 = 0;
          do {
            uVar2 = uVar7 << 0x1e;
            uVar7 = *puVar3 & 3;
            *puVar3 = uVar2 | *puVar3 >> 2;
            puVar3 = puVar3 + -1;
          } while (puVar6 <= puVar3);
        }
        if (uVar7 == 0) {
          __assert_fail("Val != 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                        ,0xed,"Rtm_Init_t Rtm_ObjRemFirst2(Rtm_Man_t *, Rtm_Edg_t *)");
        }
      }
      if (((ulong)*pRVar1 & 0xfff) == 10) {
        Rtm_ObjTransferToSmall(pRtm,pRVar1);
      }
      uVar2 = uVar7;
      if (((*(uint *)&pObj->field_0x8 & (uint)(uVar5 != 0) * 0x20 + 0x20) != 0) &&
         (uVar2 = 2, uVar7 != 1)) {
        if (uVar7 != 2) {
          __assert_fail("0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                        ,0x52,"Rtm_Init_t Rtm_InitNot(Rtm_Init_t)");
        }
        uVar2 = 1;
      }
      if ((((iVar9 != 2) || (iVar8 = 2, uVar2 != 2)) && (iVar8 = 1, iVar9 != 1)) && (uVar2 != 1)) {
        __assert_fail("0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/aig/aig/aigRet.c"
                      ,0x54,"Rtm_Init_t Rtm_InitAnd(Rtm_Init_t, Rtm_Init_t)");
      }
      iVar9 = iVar8;
      uVar5 = uVar5 + 1;
    } while (uVar5 < (*(uint *)&pObj->field_0x8 >> 7 & 0xff));
  }
  if (0 < pObj->nFanouts) {
    iVar8 = 0;
    do {
      pRVar1 = *(Rtm_Edg_t **)
                (&pObj[1].field_0x8 +
                (ulong)(((*(uint *)&pObj->field_0x8 >> 7 & 0xff) + iVar8) * 2) * 8);
      if ((*(uint *)pRVar1 & 0xfff) == 10) {
        Rtm_ObjTransferToBig(pRtm,pRVar1);
      }
      else if ((~*(uint *)pRVar1 & 0xf) == 0) {
        Rtm_ObjTransferToBigger(pRtm,pRVar1);
      }
      uVar2 = *(uint *)pRVar1;
      if ((uVar2 & 0xffe) < 10) {
        uVar2 = uVar2 + 1 & 0xfff | uVar2 & 0xfffff000 |
                (iVar9 << ((char)uVar2 * '\x02' & 0x1fU)) << 0xc;
      }
      else {
        puVar3 = (uint *)((long)pRtm->pExtra +
                         (ulong)(uVar2 >> 2 & 0x3fc) + (ulong)(uVar2 >> 0xc) * 4);
        *puVar3 = *puVar3 | iVar9 << ((char)uVar2 * '\x02' & 0x1fU);
        uVar2 = *(uint *)pRVar1 & 0xfffff000 | *(uint *)pRVar1 + 1 & 0xfff;
      }
      *(uint *)pRVar1 = uVar2;
      iVar8 = iVar8 + 1;
    } while (iVar8 < pObj->nFanouts);
  }
  return;
}

Assistant:

void Rtm_ObjRetimeFwd( Rtm_Man_t * pRtm, Rtm_Obj_t * pObj )
{
    Rtm_Init_t ValTotal, ValCur;
    Rtm_Edg_t * pEdge;
    int i;
    assert( Rtm_ObjCheckRetimeFwd(pObj) );
    // extract values and compute the result
    ValTotal = RTM_VAL_ONE;
    Rtm_ObjForEachFaninEdge( pObj, pEdge, i )
    {
        ValCur = Rtm_ObjRemFirst( pRtm, pEdge );
        ValCur = Rtm_InitNotCond( ValCur, i? pObj->fCompl1 : pObj->fCompl0 );
        ValTotal = Rtm_InitAnd( ValTotal, ValCur );
    }
    // insert the result in the fanout values
    Rtm_ObjForEachFanoutEdge( pObj, pEdge, i )
        Rtm_ObjAddLast( pRtm, pEdge, ValTotal );
}